

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

int __thiscall clask::_func_t::handle(_func_t *this,int s,request *req,bool *keep_alive)

{
  pointer *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  ulong uVar5;
  void *pvVar6;
  char *pcVar7;
  string local_4a8 [8];
  __string_type res_headers_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  undefined4 local_424;
  undefined1 local_420 [8];
  string key;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *h;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range4;
  ostringstream os_1;
  undefined1 local_268 [8];
  response res_1;
  response_writer writer;
  __string_type res_headers;
  ostringstream local_1c8 [8];
  ostringstream os;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> res;
  int code;
  bool *keep_alive_local;
  request *req_local;
  int s_local;
  _func_t *this_local;
  
  res.field_2._12_4_ = 200;
  bVar1 = std::operator!=(&this->f_string,(nullptr_t)0x0);
  if (bVar1) {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
    ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &this->f_string,req);
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    std::operator<<((ostream *)local_1c8,
                    "HTTP/1.1 200 OK\r\nContent-Type: text/plain; charset=UTF-8\r\n");
    poVar3 = std::operator<<((ostream *)local_1c8,"Connection: ");
    pcVar7 = "Close";
    if ((*keep_alive & 1U) != 0) {
      pcVar7 = "Keep-Alive";
    }
    poVar3 = std::operator<<(poVar3,pcVar7);
    std::operator<<(poVar3,"\r\n");
    poVar3 = std::operator<<((ostream *)local_1c8,"Content-Length: ");
    uVar5 = std::__cxx11::string::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
    std::operator<<(poVar3,"\r\n\r\n");
    std::__cxx11::ostringstream::str();
    pvVar6 = (void *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::size();
    send(s,pvVar6,(long)iVar2,0x4000);
    pvVar6 = (void *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::size();
    send(s,pvVar6,(long)iVar2,0x4000);
    std::__cxx11::string::~string((string *)&writer.code);
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    bVar1 = std::operator!=(&this->f_writer,(nullptr_t)0x0);
    if (bVar1) {
      this_00 = &res_1.headers.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      response_writer::response_writer((response_writer *)this_00,s,200);
      std::function<void_(clask::response_writer_&,_clask::request_&)>::operator()
                (&this->f_writer,(response_writer *)this_00,req);
      *keep_alive = false;
      res.field_2._12_4_ = writer.s;
      response_writer::~response_writer
                ((response_writer *)
                 &res_1.headers.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      bVar1 = std::operator!=(&this->f_response,(nullptr_t)0x0);
      if (bVar1) {
        std::function<clask::response_(clask::request_&)>::operator()
                  ((response *)local_268,&this->f_response,req);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range4);
        poVar3 = std::operator<<((ostream *)&__range4,"HTTP/1.1 ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_268._0_4_);
        poVar3 = std::operator<<(poVar3," ");
        pmVar4 = std::
                 unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)status_codes_abi_cxx11_,(key_type *)local_268);
        poVar3 = std::operator<<(poVar3,(string *)pmVar4);
        std::operator<<(poVar3,"\r\n");
        this_01 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&res_1.content.field_2 + 8);
        __end4 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin(this_01);
        h = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(this_01);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           *)&h), bVar1) {
          key.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end4);
          camelize((string *)local_420,(string *)key.field_2._8_8_);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_420,"Content-Length");
          if (bVar1) {
            local_424 = 3;
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&res_headers_1.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_420,": ");
            std::operator+(&local_468,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&res_headers_1.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (key.field_2._8_8_ + 0x20));
            std::operator+(&local_448,&local_468,"\r\n");
            std::operator<<((ostream *)&__range4,(string *)&local_448);
            std::__cxx11::string::~string((string *)&local_448);
            std::__cxx11::string::~string((string *)&local_468);
            std::__cxx11::string::~string((string *)(res_headers_1.field_2._M_local_buf + 8));
            local_424 = 0;
          }
          std::__cxx11::string::~string((string *)local_420);
          __gnu_cxx::
          __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator++(&__end4);
        }
        poVar3 = std::operator<<((ostream *)&__range4,"Content-Length: ");
        uVar5 = std::__cxx11::string::size();
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
        std::operator<<(poVar3,"\r\n\r\n");
        std::__cxx11::ostringstream::str();
        pvVar6 = (void *)std::__cxx11::string::data();
        iVar2 = std::__cxx11::string::size();
        send(s,pvVar6,(long)iVar2,0x4000);
        res.field_2._12_4_ = local_268._0_4_;
        std::__cxx11::string::~string(local_4a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range4);
        response::~response((response *)local_268);
      }
    }
  }
  return res.field_2._12_4_;
}

Assistant:

inline int func_t::handle(int s, request& req, bool& keep_alive) const {
  int code = 200;
  if (f_string != nullptr) {
    auto res = f_string(req);
    std::ostringstream os;
    os << "HTTP/1.1 200 OK\r\nContent-Type: text/plain; charset=UTF-8\r\n";
    os << "Connection: " << (keep_alive ? "Keep-Alive" : "Close") << "\r\n";
    os << "Content-Length: " << res.size() << "\r\n\r\n";
    auto res_headers = os.str();
    send(s, res_headers.data(), (int) res_headers.size(), MSG_NOSIGNAL);
    send(s, res.data(), (int) res.size(), MSG_NOSIGNAL);
  } else if (f_writer != nullptr) {
    response_writer writer(s, 200);
    f_writer(writer, req);
    keep_alive = false;
    code = writer.code;
  } else if (f_response != nullptr) {
    auto res = f_response(req);
    std::ostringstream os;
    os << "HTTP/1.1 " << res.code << " " << status_codes[res.code] << "\r\n";
    for (auto& h : res.headers) {
      auto key = camelize(h.first);
      if (key == "Content-Length")
        continue;
      os << key + ": " + h.second + "\r\n";
    }
    os << "Content-Length: " << res.content.size() << "\r\n\r\n";
    auto res_headers = os.str();
    send(s, res_headers.data(), (int) res_headers.size(), MSG_NOSIGNAL);
    code = res.code;
  }
  return code;
}